

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDAttDef.cpp
# Opt level: O2

XSerializable * xercesc_4_0::DTDAttDef::createObject(MemoryManager *manager)

{
  DTDAttDef *this;
  
  this = (DTDAttDef *)XMemory::operator_new(0x48,manager);
  DTDAttDef(this,manager);
  return (XSerializable *)this;
}

Assistant:

void DTDAttDef::serialize(XSerializeEngine& serEng)
{

    XMLAttDef::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng.writeSize (fElemId);
        serEng.writeString(fName);
    }
    else
    {
        serEng.readSize (fElemId);
        serEng.readString(fName);
    }
}